

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIis.cpp
# Opt level: O2

HighsStatus __thiscall
HighsIis::getData(HighsIis *this,HighsLp *lp,HighsOptions *options,HighsBasis *basis,
                 vector<int,_std::allocator<int>_> *infeasible_row)

{
  int iVar1;
  pointer pbVar2;
  pointer pbVar3;
  bool bVar4;
  pointer piVar5;
  HighsStatus HVar6;
  ulong uVar7;
  ulong uVar8;
  pointer piVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  bool bVar15;
  vector<int,_std::allocator<int>_> from_col;
  double local_438;
  vector<int,_std::allocator<int>_> from_row;
  vector<int,_std::allocator<int>_> to_row;
  HighsLp to_lp;
  
  std::vector<int,_std::allocator<int>_>::vector(&from_row,infeasible_row);
  from_col.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  from_col.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  from_col.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  to_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  to_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  to_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  to_lp.num_col_ = -1;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign(&to_row,(long)lp->num_row_,&to_lp.num_col_)
  ;
  piVar9 = (infeasible_row->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = (ulong)((long)(infeasible_row->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar9) >> 2;
  uVar12 = 0;
  uVar13 = uVar8 & 0xffffffff;
  if ((int)uVar8 < 1) {
    uVar13 = uVar12;
  }
  for (; uVar13 != uVar12; uVar12 = uVar12 + 1) {
    to_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [piVar9[uVar12]] = (int)uVar12;
  }
  for (to_lp.num_col_ = 0;
      piVar5 = from_col.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,
      piVar9 = from_col.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start, to_lp.num_col_ < lp->num_col_;
      to_lp.num_col_ = to_lp.num_col_ + 1) {
    piVar9 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    bVar15 = false;
    for (lVar10 = (long)piVar9[to_lp.num_col_]; lVar10 < piVar9[(long)to_lp.num_col_ + 1];
        lVar10 = lVar10 + 1) {
      bVar4 = !bVar15;
      bVar15 = true;
      if (bVar4) {
        bVar15 = -1 < to_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start
                      [(lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar10]];
      }
    }
    if (bVar15) {
      std::vector<int,_std::allocator<int>_>::push_back(&from_col,&to_lp.num_col_);
    }
  }
  uVar12 = (long)from_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)from_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
  HighsLp::HighsLp(&to_lp);
  uVar12 = uVar12 >> 2;
  uVar13 = (ulong)((long)piVar5 - (long)piVar9) >> 2;
  to_lp.num_col_ = (HighsInt)uVar13;
  iVar14 = (int)uVar12;
  pbVar2 = (lp->col_names_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (lp->col_names_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar8 = 0;
  to_lp.num_row_ = iVar14;
  to_lp.a_matrix_.num_col_ = to_lp.num_col_;
  to_lp.a_matrix_.num_row_ = iVar14;
  uVar13 = uVar13 & 0xffffffff;
  if (to_lp.num_col_ < 1) {
    uVar13 = uVar8;
  }
  for (; uVar8 != uVar13; uVar8 = uVar8 + 1) {
    local_438 = 0.0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(&to_lp.col_cost_,&local_438);
    std::vector<double,_std::allocator<double>_>::push_back
              (&to_lp.col_lower_,
               (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start +
               from_col.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar8]);
    std::vector<double,_std::allocator<double>_>::push_back
              (&to_lp.col_upper_,
               (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start +
               from_col.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar8]);
    if (pbVar3 != pbVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&to_lp.col_names_,
                  (lp->col_names_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start +
                  from_col.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar8]);
    }
    uVar7 = (ulong)from_col.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar8];
    piVar9 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar11 = (long)piVar9[uVar7];
    lVar10 = lVar11 * 8;
    for (; lVar11 < piVar9[(long)(int)uVar7 + 1]; lVar11 = lVar11 + 1) {
      iVar1 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar11];
      if (-1 < to_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[iVar1]) {
        std::vector<int,_std::allocator<int>_>::push_back
                  (&to_lp.a_matrix_.index_,
                   to_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + iVar1);
        std::vector<double,_std::allocator<double>_>::push_back
                  (&to_lp.a_matrix_.value_,
                   (value_type_conflict1 *)
                   ((long)(lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar10));
        piVar9 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar7 = (ulong)(uint)from_col.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar8];
      }
      lVar10 = lVar10 + 8;
    }
    local_438 = (double)CONCAT44(local_438._4_4_,
                                 (int)((ulong)((long)to_lp.a_matrix_.index_.
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data._M_finish -
                                              (long)to_lp.a_matrix_.index_.
                                                    super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data._M_start) >> 2))
    ;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&to_lp.a_matrix_.start_,(int *)&local_438);
  }
  pbVar2 = (lp->row_names_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (lp->row_names_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar8 = 0;
  uVar13 = uVar12 & 0xffffffff;
  if (iVar14 < 1) {
    uVar13 = uVar8;
  }
  for (; uVar13 != uVar8; uVar8 = uVar8 + 1) {
    std::vector<double,_std::allocator<double>_>::push_back
              (&to_lp.row_lower_,
               (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start +
               from_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar8]);
    std::vector<double,_std::allocator<double>_>::push_back
              (&to_lp.row_upper_,
               (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start +
               from_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar8]);
    if (pbVar3 != pbVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&to_lp.row_names_,
                  (lp->row_names_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start +
                  from_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar8]);
    }
  }
  HVar6 = compute(this,&to_lp,options,(HighsBasis *)0x0);
  if (HVar6 == kOk) {
    piVar9 = (this->col_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = (ulong)((long)(this->col_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar9) >> 2;
    uVar12 = 0;
    uVar13 = uVar8 & 0xffffffff;
    if ((int)uVar8 < 1) {
      uVar13 = uVar12;
    }
    for (; uVar13 != uVar12; uVar12 = uVar12 + 1) {
      piVar9[uVar12] =
           from_col.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[piVar9[uVar12]];
    }
    piVar9 = (this->row_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = (ulong)((long)(this->row_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar9) >> 2;
    HVar6 = kOk;
    uVar13 = uVar8 & 0xffffffff;
    if ((int)uVar8 < 1) {
      uVar13 = 0;
    }
    for (uVar8 = 0; uVar13 != uVar8; uVar8 = uVar8 + 1) {
      piVar9[uVar8] =
           from_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[piVar9[uVar8]];
    }
  }
  else {
    HVar6 = kError;
  }
  HighsLp::~HighsLp(&to_lp);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&to_row.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&from_col.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&from_row.super__Vector_base<int,_std::allocator<int>_>);
  return HVar6;
}

Assistant:

HighsStatus HighsIis::getData(const HighsLp& lp, const HighsOptions& options,
                              const HighsBasis& basis,
                              const std::vector<HighsInt>& infeasible_row) {
  // Check for trivial IIS should have been done earlier
  assert(!this->trivial(lp, options));
  // The number of infeasible rows must be positive
  assert(infeasible_row.size() > 0);
  // Identify the LP corresponding to the set of infeasible rows
  std::vector<HighsInt> from_row = infeasible_row;
  std::vector<HighsInt> from_col;
  std::vector<HighsInt> to_row;
  to_row.assign(lp.num_row_, -1);
  assert(lp.a_matrix_.isColwise());
  // Determine how to detect whether a row is in infeasible_row and
  // (then) gather information about it
  for (HighsInt iX = 0; iX < HighsInt(infeasible_row.size()); iX++)
    to_row[infeasible_row[iX]] = iX;
  // Identify the columns (from_col) with nonzeros in the infeasible
  // rows
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    bool use_col = false;
    for (HighsInt iEl = lp.a_matrix_.start_[iCol];
         iEl < lp.a_matrix_.start_[iCol + 1]; iEl++)
      use_col = use_col || to_row[lp.a_matrix_.index_[iEl]] >= 0;
    if (use_col) from_col.push_back(iCol);
  }
  HighsInt to_num_col = from_col.size();
  HighsInt to_num_row = from_row.size();
  HighsLp to_lp;
  to_lp.num_col_ = to_num_col;
  to_lp.num_row_ = to_num_row;
  to_lp.a_matrix_.num_col_ = to_lp.num_col_;
  to_lp.a_matrix_.num_row_ = to_lp.num_row_;
  const bool has_col_names = lp.col_names_.size() > 0;
  for (HighsInt iCol = 0; iCol < to_num_col; iCol++) {
    to_lp.col_cost_.push_back(0);
    to_lp.col_lower_.push_back(lp.col_lower_[from_col[iCol]]);
    to_lp.col_upper_.push_back(lp.col_upper_[from_col[iCol]]);
    if (has_col_names)
      to_lp.col_names_.push_back(lp.col_names_[from_col[iCol]]);
    for (HighsInt iEl = lp.a_matrix_.start_[from_col[iCol]];
         iEl < lp.a_matrix_.start_[from_col[iCol] + 1]; iEl++) {
      HighsInt iRow = lp.a_matrix_.index_[iEl];
      if (to_row[iRow] >= 0) {
        to_lp.a_matrix_.index_.push_back(to_row[iRow]);
        to_lp.a_matrix_.value_.push_back(lp.a_matrix_.value_[iEl]);
      }
    }
    to_lp.a_matrix_.start_.push_back(to_lp.a_matrix_.index_.size());
  }
  const bool has_row_names = lp.row_names_.size() > 0;
  for (HighsInt iRow = 0; iRow < to_num_row; iRow++) {
    to_lp.row_lower_.push_back(lp.row_lower_[from_row[iRow]]);
    to_lp.row_upper_.push_back(lp.row_upper_[from_row[iRow]]);
    if (has_row_names)
      to_lp.row_names_.push_back(lp.row_names_[from_row[iRow]]);
  }
  if (this->compute(to_lp, options) != HighsStatus::kOk)
    return HighsStatus::kError;
  // Indirect the values into the original LP
  for (HighsInt iCol = 0; iCol < HighsInt(this->col_index_.size()); iCol++)
    this->col_index_[iCol] = from_col[this->col_index_[iCol]];
  for (HighsInt iRow = 0; iRow < HighsInt(this->row_index_.size()); iRow++)
    this->row_index_[iRow] = from_row[this->row_index_[iRow]];
  if (kIisDevReport) this->report("On exit", lp);
  return HighsStatus::kOk;
}